

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O3

Var Js::JavascriptOperators::NewScObjectHostDispatchOrProxy
              (RecyclableObject *function,ScriptContext *requestContext)

{
  ScriptContext *scriptContext;
  bool bVar1;
  RecyclableObject *pRVar2;
  Var aValue;
  DynamicObject *pDVar3;
  
  scriptContext =
       (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
       scriptContext.ptr;
  pRVar2 = GetPrototypeObject(function,scriptContext);
  aValue = CrossSite::MarshalVar(requestContext,pRVar2,scriptContext);
  pRVar2 = VarTo<Js::RecyclableObject>(aValue);
  pDVar3 = JavascriptLibrary::CreateObject
                     ((requestContext->super_ScriptContextBase).javascriptLibrary,pRVar2,0);
  bVar1 = ConfigFlagsTable::IsEnabled((ConfigFlagsTable *)&Configuration::Global,autoProxyFlag);
  if (bVar1) {
    pRVar2 = JavascriptProxy::AutoProxyWrapper(pDVar3);
    pDVar3 = VarTo<Js::DynamicObject,Js::RecyclableObject>(pRVar2);
    return pDVar3;
  }
  return pDVar3;
}

Assistant:

Var JavascriptOperators::NewScObjectHostDispatchOrProxy(RecyclableObject * function, ScriptContext * requestContext)
    {
        ScriptContext* functionScriptContext = function->GetScriptContext();

        RecyclableObject * prototype = JavascriptOperators::GetPrototypeObject(function, functionScriptContext);
        prototype = VarTo<RecyclableObject>(CrossSite::MarshalVar(requestContext, prototype, functionScriptContext));

        Var object = requestContext->GetLibrary()->CreateObject(prototype);
        JS_ETW(EventWriteJSCRIPT_RECYCLER_ALLOCATE_OBJECT(object));
#if ENABLE_DEBUG_CONFIG_OPTIONS
        if (Js::Configuration::Global.flags.IsEnabled(Js::autoProxyFlag))
        {
            object = VarTo<DynamicObject>(JavascriptProxy::AutoProxyWrapper(object));
        }
#endif
        return object;
    }